

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O1

void __thiscall nite::PoliVec2::set(PoliVec2 *this,string *w,string *h)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  double dVar4;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  string wi;
  string hi;
  
  this->useAbs = false;
  pcVar2 = (w->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar2,pcVar2 + w->_M_string_length)
  ;
  strRemoveSpaces((string *)local_68,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  paVar1 = &local_88.field_2;
  pcVar2 = (h->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,pcVar2,pcVar2 + h->_M_string_length)
  ;
  strRemoveSpaces((string *)((long)&wi.field_2 + 8),&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (((pointer)((long)local_68 + -1))[(long)wi._M_dataplus._M_p] == '%') {
    if (wi._M_dataplus._M_p == (pointer)0x0) goto LAB_001b74a9;
    *(char *)((long)local_68 + (long)(wi._M_dataplus._M_p + -1)) = '\0';
    wi._M_dataplus._M_p = wi._M_dataplus._M_p + -1;
  }
  if (hi._M_dataplus._M_p[wi.field_2._8_8_ + -1] == '%') {
    if (hi._M_dataplus._M_p == (pointer)0x0) {
LAB_001b74a9:
      uVar3 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (local_68 != (undefined1  [8])&wi._M_string_length) {
        operator_delete((void *)local_68);
      }
      _Unwind_Resume(uVar3);
    }
    (hi._M_dataplus._M_p + -1)[wi.field_2._8_8_] = '\0';
    hi._M_dataplus._M_p = hi._M_dataplus._M_p + -1;
  }
  dVar4 = toFloat((string *)local_68);
  (this->rel).x = (float)(dVar4 / 100.0);
  dVar4 = toFloat((string *)((long)&wi.field_2 + 8));
  (this->rel).y = (float)(dVar4 / 100.0);
  if ((size_type *)wi.field_2._8_8_ != &hi._M_string_length) {
    operator_delete((void *)wi.field_2._8_8_);
  }
  if (local_68 != (undefined1  [8])&wi._M_string_length) {
    operator_delete((void *)local_68);
  }
  return;
}

Assistant:

void nite::PoliVec2::set(const String &w, const String &h){
    this->useAbs = false;
    String wi = nite::strRemoveSpaces(w);
    String hi = nite::strRemoveSpaces(h);
    if(wi[wi.length()-1] == '%'){
        wi.erase(wi.length()-1);
    }
    if(hi[hi.length()-1] == '%'){
        hi.erase(hi.length()-1);
    }    
    this->rel.x = nite::toFloat(wi) / 100.0f;
    this->rel.y = nite::toFloat(hi) / 100.0f;
}